

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O2

size_t __thiscall kiste::line_data_t::add_segment(line_data_t *this,segment_t *segment)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  
  if (segment->_type == text) {
    pcVar1 = (segment->_text)._M_dataplus._M_p;
    sVar2 = (segment->_text)._M_string_length;
    for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
      add_character(this,pcVar1[sVar3]);
    }
  }
  else {
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::push_back
              (&this->_segments,segment);
  }
  return segment->_end_pos;
}

Assistant:

auto line_data_t::add_segment(const segment_t& segment) -> size_t
  {
    switch (segment._type)
    {
    case segment_type::text:
      for (const auto c : segment._text)
      {
        add_character(c);
      }
      break;
    default:
      _segments.push_back(segment);
      break;
    }

    return segment._end_pos;
  }